

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O3

unsigned_long __thiscall
rc::detail::BitStream<rc::Random>::next<unsigned_long>(BitStream<rc::Random> *this,uint nbits)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  unsigned_long uVar9;
  
  uVar5 = 0x40;
  if ((int)nbits < 0x40) {
    uVar5 = nbits;
  }
  if ((int)nbits < 1) {
    uVar9 = 0;
  }
  else {
    uVar6 = this->m_numBits;
    uVar9 = 0;
    uVar2 = uVar5;
    do {
      if (uVar6 == 0) {
        uVar4 = Random::next(&this->m_source);
        this->m_bits = uVar4;
        uVar6 = this->m_numBits + 0x40;
      }
      else {
        uVar4 = this->m_bits;
      }
      uVar3 = uVar6;
      if ((int)uVar2 < (int)uVar6) {
        uVar3 = uVar2;
      }
      uVar7 = ~(-1L << ((byte)uVar3 & 0x3f));
      if (0x3f < (int)uVar3) {
        uVar7 = 0xffffffffffffffff;
      }
      if (uVar3 < 0x40) {
        this->m_bits = uVar4 >> ((byte)uVar3 & 0x3f);
      }
      uVar9 = uVar9 | (uVar7 & uVar4) << ((char)uVar5 - (char)uVar2 & 0x3fU);
      uVar6 = uVar6 - uVar3;
      this->m_numBits = uVar6;
      uVar8 = uVar2 - uVar3;
      bVar1 = (int)uVar3 <= (int)uVar2;
      uVar2 = uVar8;
    } while (uVar8 != 0 && bVar1);
  }
  return uVar9;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}